

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall helics::apps::Clone::buildArgParserApp(Clone *this)

{
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  element_type *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  shared_ptr<helics::helicsCLI11App> *app;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char (*in_stack_fffffffffffffee8) [39];
  allocator<char> *in_stack_fffffffffffffef0;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> in_stack_ffffffffffffff2f;
  Option *in_stack_ffffffffffffff30;
  allocator<char> local_a9 [40];
  allocator<char> local_81 [9];
  string *in_stack_ffffffffffffff88;
  bool *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  App *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  App *in_stack_ffffffffffffffe0;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[39]>(in_stack_fffffffffffffee8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  if (bVar1) {
    __s = CLI::std::
          __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x41dce0);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffa7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)__s,in_stack_fffffffffffffef0);
    __a = local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
    CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    CLI::Option::ignore_underscore<CLI::App>
              (in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
    std::__cxx11::string::~string(in_stack_fffffffffffffec0);
    std::allocator<char>::~allocator(local_81);
    std::__cxx11::string::~string(in_stack_fffffffffffffec0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x41ddc4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator(local_a9);
    sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<helics::helicsCLI11App>)
           sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  message._M_str = in_stack_fffffffffffffee0;
  message._M_len = in_stack_fffffffffffffed8;
  FunctionExecutionFailure::FunctionExecutionFailure
            ((FunctionExecutionFailure *)in_stack_fffffffffffffed0,message);
  __cxa_throw(uVar2,&FunctionExecutionFailure::typeinfo,
              FunctionExecutionFailure::~FunctionExecutionFailure);
}

Assistant:

std::shared_ptr<helicsCLI11App> Clone::buildArgParserApp()
{
    auto app = std::make_shared<helicsCLI11App>("Command line options for the Clone App");
    if (!app) {
        throw(FunctionExecutionFailure("unable to allocate application CLI"));
    }
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();

    app->add_option(
        "--capture,capture",
        captureFederate,
        "clone all the interfaces of a particular federate federate capture=\"fed1;fed2\"  "
        "supports multiple arguments or a semicolon/comma separated list");

    return app;
}